

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O0

InstId asmjit::_abi_1_10::x86::InstInternal::stringToInstId(Arch arch,char *s,size_t len)

{
  uint uVar1;
  int iVar2;
  ulong bSize;
  long lVar3;
  ulong in_RDX;
  char *in_RSI;
  int result;
  size_t nameSize;
  size_t instId;
  size_t lim;
  char nameData [32];
  size_t end;
  size_t base;
  uint32_t prefix;
  char *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  ulong local_28;
  ulong local_18;
  Arch local_5 [5];
  
  DebugUtils::unused<asmjit::_abi_1_10::Arch&>(local_5);
  if (in_RSI != (char *)0x0) {
    local_18 = in_RDX;
    if (in_RDX == 0xffffffffffffffff) {
      local_18 = strlen(in_RSI);
    }
    if ((local_18 != 0 && local_18 < 0x12) && (uVar1 = (int)*in_RSI - 0x61, uVar1 < 0x1a)) {
      local_28 = (ulong)*(ushort *)(InstDB::instNameIndex + (ulong)uVar1 * 4);
      if (local_28 != 0) {
        for (bSize = *(ushort *)(InstDB::instNameIndex + (ulong)uVar1 * 4 + 2) - local_28;
            bSize != 0; bSize = bSize >> 1) {
          lVar3 = local_28 + (bSize >> 1);
          Support::decodeInstName
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
          iVar2 = Support::compareStringViews
                            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8,bSize);
          if (-1 < iVar2) {
            if (iVar2 < 1) {
              return (InstId)lVar3;
            }
            local_28 = lVar3 + 1;
            bSize = bSize - 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

InstId InstInternal::stringToInstId(Arch arch, const char* s, size_t len) noexcept {
  DebugUtils::unused(arch);

  if (ASMJIT_UNLIKELY(!s))
    return Inst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > InstDB::kMaxNameSize))
    return Inst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  size_t base = InstDB::instNameIndex[prefix].start;
  size_t end = InstDB::instNameIndex[prefix].end;

  if (ASMJIT_UNLIKELY(!base))
    return Inst::kIdNone;

  char nameData[32];
  for (size_t lim = end - base; lim != 0; lim >>= 1) {
    size_t instId = base + (lim >> 1);
    size_t nameSize = Support::decodeInstName(nameData, InstDB::_instNameIndexTable[instId], InstDB::_instNameStringTable);

    int result = Support::compareStringViews(s, len, nameData, nameSize);
    if (result < 0)
      continue;

    if (result > 0) {
      base = instId + 1;
      lim--;
      continue;
    }

    return InstId(instId);
  }

  return Inst::kIdNone;
}